

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzNegMod_fast(word *b,word *a,word *mod,size_t n)

{
  bool_t bVar1;
  
  bVar1 = wwIsZero(a,n);
  if (bVar1 != 0) {
    wwSetZero(b,n);
    return;
  }
  zzSub(b,mod,a,n);
  return;
}

Assistant:

void FAST(zzNegMod)(word b[], const word a[], const word mod[], size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0);
	// a != 0 => b <- mod - a
	if (!wwIsZero(a, n))
		zzSub(b, mod, a, n);
	else
		wwSetZero(b, n);
}